

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_initCStream(ZSTD_CStream *zcs,int compressionLevel)

{
  int iVar1;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = 0;
  ZSTD_clearAllDicts(zcs);
  zcs->cdict = (ZSTD_CDict *)0x0;
  if (zcs->streamStage != zcss_init) {
    zcs->cParamsChanged = 1;
  }
  iVar1 = -0x20000;
  if (((-0x20001 < compressionLevel) && (iVar1 = 0x16, compressionLevel < 0x17)) &&
     (iVar1 = 3, compressionLevel != 0)) {
    iVar1 = compressionLevel;
  }
  (zcs->requestedParams).compressionLevel = iVar1;
  return 0;
}

Assistant:

size_t ZSTD_initCStream(ZSTD_CStream* zcs, int compressionLevel)
{
    DEBUGLOG(4, "ZSTD_initCStream");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, NULL) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    return 0;
}